

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O1

ma_result ma_dr_flac__seek_flac_frame(ma_dr_flac *pFlac)

{
  ma_dr_flac_bs *bs;
  char cVar1;
  ma_uint8 mVar2;
  ma_uint16 mVar3;
  ushort uVar4;
  uint uVar5;
  byte bVar6;
  ma_bool32 mVar7;
  uint uVar8;
  uint uVar9;
  undefined8 in_RAX;
  ulong uVar10;
  ushort uVar11;
  ulong uVar12;
  ma_result mVar13;
  uint uVar14;
  uint uVar15;
  size_t bitsToSeek;
  long lVar16;
  ma_uint16 desiredCRC16;
  undefined8 uStack_38;
  
  cVar1 = (&DAT_001a0060)[(char)(pFlac->currentFLACFrame).header.channelAssignment];
  bs = &pFlac->bs;
  lVar16 = 0;
  uStack_38 = in_RAX;
  do {
    mVar7 = ma_dr_flac__read_subframe_header
                      (bs,(ma_dr_flac_subframe *)
                          (&(pFlac->currentFLACFrame).subframes[0].subframeType + lVar16));
    if (mVar7 == 0) {
      return MA_ERROR;
    }
    mVar2 = (pFlac->currentFLACFrame).header.channelAssignment;
    uVar14 = (uint)(pFlac->currentFLACFrame).header.bitsPerSample;
    if (mVar2 == '\b') {
      if (lVar16 != 0x10) goto LAB_00190d97;
LAB_00190dbb:
      uVar14 = uVar14 + 1;
    }
    else {
      if (lVar16 == 0x10 && mVar2 == '\n') goto LAB_00190dbb;
LAB_00190d97:
      uVar14 = uVar14 + (lVar16 == 0 && mVar2 == '\t');
    }
    uVar8 = (uint)(&(pFlac->currentFLACFrame).subframes[0].wastedBitsPerSample)[lVar16];
    uVar15 = uVar14 - uVar8;
    if (uVar14 < uVar8 || uVar15 == 0) {
      return MA_ERROR;
    }
    *(undefined8 *)((long)&(pFlac->currentFLACFrame).subframes[0].pSamplesS32 + lVar16) = 0;
    bVar6 = (&(pFlac->currentFLACFrame).subframes[0].subframeType)[lVar16];
    if (bVar6 < 8) {
      if (bVar6 != 0) {
        if (bVar6 != 1) {
          return MA_ERROR;
        }
        uVar15 = uVar15 * (pFlac->currentFLACFrame).header.blockSizeInPCMFrames;
      }
      mVar7 = ma_dr_flac__seek_bits(bs,(ulong)uVar15);
    }
    else {
      if (bVar6 == 8) {
        bitsToSeek = (size_t)(uVar15 * (&(pFlac->currentFLACFrame).subframes[0].lpcOrder)[lVar16]);
      }
      else {
        if (bVar6 != 0x20) {
          return MA_ERROR;
        }
        mVar7 = ma_dr_flac__seek_bits
                          (bs,(ulong)(uVar15 * (&(pFlac->currentFLACFrame).subframes[0].lpcOrder)
                                               [lVar16]));
        if (mVar7 == 0) {
          return MA_ERROR;
        }
        mVar7 = ma_dr_flac__read_uint8(bs,4,(ma_uint8 *)((long)&uStack_38 + 5));
        if (mVar7 == 0) {
          return MA_ERROR;
        }
        if (uStack_38._5_1_ == '\x0f') {
          return MA_ERROR;
        }
        bVar6 = uStack_38._5_1_ + 1;
        uStack_38._0_6_ = CONCAT15(bVar6,(undefined5)uStack_38);
        bitsToSeek = (ulong)bVar6 *
                     (ulong)(&(pFlac->currentFLACFrame).subframes[0].lpcOrder)[lVar16] + 5;
      }
      mVar7 = ma_dr_flac__seek_bits(bs,bitsToSeek);
      if (mVar7 == 0) {
        return MA_ERROR;
      }
      mVar7 = ma_dr_flac__read_and_seek_residual
                        (bs,(uint)(pFlac->currentFLACFrame).header.blockSizeInPCMFrames,
                         (uint)(&(pFlac->currentFLACFrame).subframes[0].lpcOrder)[lVar16]);
    }
    if (mVar7 == 0) {
      return MA_ERROR;
    }
    lVar16 = lVar16 + 0x10;
    if ((ulong)(byte)(cVar1 + (cVar1 == '\0')) * 0x10 == lVar16) {
      mVar7 = ma_dr_flac__seek_bits(bs,(ulong)(-(pFlac->bs).consumedBits & 7));
      mVar13 = MA_ERROR;
      if (mVar7 != 0) {
        uVar14 = (pFlac->bs).consumedBits;
        uVar11 = (pFlac->bs).crc16;
        uVar12 = (ulong)uVar11;
        uVar8 = (uint)uVar11;
        uVar10 = (pFlac->bs).crc16Cache;
        if (uVar14 == 0x40) {
          uVar9 = (uint)uVar10;
          uVar4 = (ushort)(uVar10 >> 0x30);
          uVar15 = (uint)(uVar10 >> 0x10);
          uVar14 = (uint)(uVar10 >> 0x18);
          uVar5 = (uint)(uVar10 >> 0x20);
          switch((pFlac->bs).crc16CacheIgnoredBytes) {
          case 0:
            (pFlac->bs).crc16 =
                 ma_dr_flac__crc16_table
                 [((uint)ma_dr_flac__crc16_table
                         [((uint)ma_dr_flac__crc16_table
                                 [(uVar5 >> 8 ^
                                  ((uint)ma_dr_flac__crc16_table
                                         [(uint)(uVar11 >> 8) ^ (uint)(byte)(uVar10 >> 0x38)] << 8 ^
                                  (uint)ma_dr_flac__crc16_table
                                        [((uint)uVar4 ^
                                         ((uint)uVar11 << 8 ^
                                         (uint)ma_dr_flac__crc16_table
                                               [(uint)(uVar11 >> 8) ^ (uint)(byte)(uVar10 >> 0x38)])
                                         >> 8 & 0xff) & 0xff]) >> 8 & 0xff) & 0xff] << 8 ^
                          (uint)ma_dr_flac__crc16_table
                                [(uVar5 ^ ((uint)ma_dr_flac__crc16_table
                                                 [((uint)uVar4 ^
                                                  ((uint)uVar11 << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uint)(uVar11 >> 8) ^
                                                         (uint)(byte)(uVar10 >> 0x38)]) >> 8 & 0xff)
                                                  & 0xff] << 8 ^
                                          (uint)ma_dr_flac__crc16_table
                                                [(uVar5 >> 8 ^
                                                 ((uint)ma_dr_flac__crc16_table
                                                        [(uint)(uVar11 >> 8) ^
                                                         (uint)(byte)(uVar10 >> 0x38)] << 8 ^
                                                 (uint)ma_dr_flac__crc16_table
                                                       [((uint)uVar4 ^
                                                        ((uint)uVar11 << 8 ^
                                                        (uint)ma_dr_flac__crc16_table
                                                              [(uint)(uVar11 >> 8) ^
                                                               (uint)(byte)(uVar10 >> 0x38)]) >> 8 &
                                                        0xff) & 0xff]) >> 8 & 0xff) & 0xff]) >> 8 &
                                          0xff) & 0xff]) >> 8 & 0xff ^ uVar14 & 0xff] << 8 ^ uVar9 ^
                  (uint)ma_dr_flac__crc16_table
                        [(((uint)ma_dr_flac__crc16_table
                                 [(uVar5 ^ ((uint)ma_dr_flac__crc16_table
                                                  [((uint)uVar4 ^
                                                   ((uint)uVar11 << 8 ^
                                                   (uint)ma_dr_flac__crc16_table
                                                         [(uint)(uVar11 >> 8) ^
                                                          (uint)(byte)(uVar10 >> 0x38)]) >> 8 & 0xff
                                                   ) & 0xff] << 8 ^
                                           (uint)ma_dr_flac__crc16_table
                                                 [(uVar5 >> 8 ^
                                                  ((uint)ma_dr_flac__crc16_table
                                                         [(uint)(uVar11 >> 8) ^
                                                          (uint)(byte)(uVar10 >> 0x38)] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [((uint)uVar4 ^
                                                         ((uint)uVar11 << 8 ^
                                                         (uint)ma_dr_flac__crc16_table
                                                               [(uint)(uVar11 >> 8) ^
                                                                (uint)(byte)(uVar10 >> 0x38)]) >> 8
                                                         & 0xff) & 0xff]) >> 8 & 0xff) & 0xff]) >> 8
                                           & 0xff) & 0xff] << 8 ^
                          (uint)ma_dr_flac__crc16_table
                                [((uint)ma_dr_flac__crc16_table
                                        [(uVar5 >> 8 ^
                                         ((uint)ma_dr_flac__crc16_table
                                                [(uint)(uVar11 >> 8) ^ (uint)(byte)(uVar10 >> 0x38)]
                                          << 8 ^ (uint)ma_dr_flac__crc16_table
                                                       [((uint)uVar4 ^
                                                        ((uint)uVar11 << 8 ^
                                                        (uint)ma_dr_flac__crc16_table
                                                              [(uint)(uVar11 >> 8) ^
                                                               (uint)(byte)(uVar10 >> 0x38)]) >> 8 &
                                                        0xff) & 0xff]) >> 8 & 0xff) & 0xff] << 8 ^
                                 (uint)ma_dr_flac__crc16_table
                                       [(uVar5 ^ ((uint)ma_dr_flac__crc16_table
                                                        [((uint)uVar4 ^
                                                         ((uint)uVar11 << 8 ^
                                                         (uint)ma_dr_flac__crc16_table
                                                               [(uint)(uVar11 >> 8) ^
                                                                (uint)(byte)(uVar10 >> 0x38)]) >> 8
                                                         & 0xff) & 0xff] << 8 ^
                                                 (uint)ma_dr_flac__crc16_table
                                                       [(uVar5 >> 8 ^
                                                        ((uint)ma_dr_flac__crc16_table
                                                               [(uint)(uVar11 >> 8) ^
                                                                (uint)(byte)(uVar10 >> 0x38)] << 8 ^
                                                        (uint)ma_dr_flac__crc16_table
                                                              [((uint)uVar4 ^
                                                               ((uint)uVar11 << 8 ^
                                                               (uint)ma_dr_flac__crc16_table
                                                                     [(uint)(uVar11 >> 8) ^
                                                                      (uint)(byte)(uVar10 >> 0x38)])
                                                               >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                                        0xff]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff ^
                                 uVar14 & 0xff]) >> 8 & 0xff ^ uVar15 & 0xffff) & 0xff]) >> 8 & 0xff
                 ] << 8 ^ ma_dr_flac__crc16_table
                          [(((uint)ma_dr_flac__crc16_table
                                   [(((uint)ma_dr_flac__crc16_table
                                            [(uVar5 ^ ((uint)ma_dr_flac__crc16_table
                                                             [((uint)uVar4 ^
                                                              ((uint)uVar11 << 8 ^
                                                              (uint)ma_dr_flac__crc16_table
                                                                    [(uint)(uVar11 >> 8) ^
                                                                     (uint)(byte)(uVar10 >> 0x38)])
                                                              >> 8 & 0xff) & 0xff] << 8 ^
                                                      (uint)ma_dr_flac__crc16_table
                                                            [(uVar5 >> 8 ^
                                                             ((uint)ma_dr_flac__crc16_table
                                                                    [(uint)(uVar11 >> 8) ^
                                                                     (uint)(byte)(uVar10 >> 0x38)]
                                                              << 8 ^ (uint)ma_dr_flac__crc16_table
                                                                           [((uint)uVar4 ^
                                                                            ((uint)uVar11 << 8 ^
                                                                            (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar11 >> 8) ^
                                                   (uint)(byte)(uVar10 >> 0x38)]) >> 8 & 0xff) &
                                                  0xff]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff) & 0xff]
                                      << 8 ^ (uint)ma_dr_flac__crc16_table
                                                   [((uint)ma_dr_flac__crc16_table
                                                           [(uVar5 >> 8 ^
                                                            ((uint)ma_dr_flac__crc16_table
                                                                   [(uint)(uVar11 >> 8) ^
                                                                    (uint)(byte)(uVar10 >> 0x38)] <<
                                                             8 ^ (uint)ma_dr_flac__crc16_table
                                                                       [((uint)uVar4 ^
                                                                        ((uint)uVar11 << 8 ^
                                                                        (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar11 >> 8) ^
                                                   (uint)(byte)(uVar10 >> 0x38)]) >> 8 & 0xff) &
                                                  0xff]) >> 8 & 0xff) & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar5 ^ ((uint)ma_dr_flac__crc16_table
                                                                         [((uint)uVar4 ^
                                                                          ((uint)uVar11 << 8 ^
                                                                          (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar11 >> 8) ^
                                                   (uint)(byte)(uVar10 >> 0x38)]) >> 8 & 0xff) &
                                                  0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar5 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(uVar11 >> 8) ^
                                                                 (uint)(byte)(uVar10 >> 0x38)] << 8
                                                         ^ (uint)ma_dr_flac__crc16_table
                                                                 [((uint)uVar4 ^
                                                                  ((uint)uVar11 << 8 ^
                                                                  (uint)ma_dr_flac__crc16_table
                                                                        [(uint)(uVar11 >> 8) ^
                                                                         (uint)(byte)(uVar10 >> 0x38
                                                                                     )]) >> 8 & 0xff
                                                                  ) & 0xff]) >> 8 & 0xff) & 0xff])
                                                  >> 8 & 0xff) & 0xff]) >> 8 & 0xff ^ uVar14 & 0xff]
                                     ) >> 8 & 0xff ^ uVar15 & 0xffff) & 0xff] << 8 ^
                            (uint)ma_dr_flac__crc16_table
                                  [((uint)ma_dr_flac__crc16_table
                                          [((uint)ma_dr_flac__crc16_table
                                                  [(uVar5 >> 8 ^
                                                   ((uint)ma_dr_flac__crc16_table
                                                          [(uint)(uVar11 >> 8) ^
                                                           (uint)(byte)(uVar10 >> 0x38)] << 8 ^
                                                   (uint)ma_dr_flac__crc16_table
                                                         [((uint)uVar4 ^
                                                          ((uint)uVar11 << 8 ^
                                                          (uint)ma_dr_flac__crc16_table
                                                                [(uint)(uVar11 >> 8) ^
                                                                 (uint)(byte)(uVar10 >> 0x38)]) >> 8
                                                          & 0xff) & 0xff]) >> 8 & 0xff) & 0xff] << 8
                                           ^ (uint)ma_dr_flac__crc16_table
                                                   [(uVar5 ^ ((uint)ma_dr_flac__crc16_table
                                                                    [((uint)uVar4 ^
                                                                     ((uint)uVar11 << 8 ^
                                                                     (uint)ma_dr_flac__crc16_table
                                                                           [(uint)(uVar11 >> 8) ^
                                                                            (uint)(byte)(uVar10 >>
                                                                                        0x38)]) >> 8
                                                                     & 0xff) & 0xff] << 8 ^
                                                             (uint)ma_dr_flac__crc16_table
                                                                   [(uVar5 >> 8 ^
                                                                    ((uint)ma_dr_flac__crc16_table
                                                                           [(uint)(uVar11 >> 8) ^
                                                                            (uint)(byte)(uVar10 >>
                                                                                        0x38)] << 8
                                                                    ^ (uint)ma_dr_flac__crc16_table
                                                                            [((uint)uVar4 ^
                                                                             ((uint)uVar11 << 8 ^
                                                                             (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar11 >> 8) ^
                                                   (uint)(byte)(uVar10 >> 0x38)]) >> 8 & 0xff) &
                                                  0xff]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff) & 0xff])
                                           >> 8 & 0xff ^ uVar14 & 0xff] << 8 ^ uVar9 ^
                                   (uint)ma_dr_flac__crc16_table
                                         [(((uint)ma_dr_flac__crc16_table
                                                  [(uVar5 ^ ((uint)ma_dr_flac__crc16_table
                                                                   [((uint)uVar4 ^
                                                                    ((uint)uVar11 << 8 ^
                                                                    (uint)ma_dr_flac__crc16_table
                                                                          [(uint)(uVar11 >> 8) ^
                                                                           (uint)(byte)(uVar10 >>
                                                                                       0x38)]) >> 8
                                                                    & 0xff) & 0xff] << 8 ^
                                                            (uint)ma_dr_flac__crc16_table
                                                                  [(uVar5 >> 8 ^
                                                                   ((uint)ma_dr_flac__crc16_table
                                                                          [(uint)(uVar11 >> 8) ^
                                                                           (uint)(byte)(uVar10 >>
                                                                                       0x38)] << 8 ^
                                                                   (uint)ma_dr_flac__crc16_table
                                                                         [((uint)uVar4 ^
                                                                          ((uint)uVar11 << 8 ^
                                                                          (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar11 >> 8) ^
                                                   (uint)(byte)(uVar10 >> 0x38)]) >> 8 & 0xff) &
                                                  0xff]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff) & 0xff]
                                            << 8 ^ (uint)ma_dr_flac__crc16_table
                                                         [((uint)ma_dr_flac__crc16_table
                                                                 [(uVar5 >> 8 ^
                                                                  ((uint)ma_dr_flac__crc16_table
                                                                         [(uint)(uVar11 >> 8) ^
                                                                          (uint)(byte)(uVar10 >>
                                                                                      0x38)] << 8 ^
                                                                  (uint)ma_dr_flac__crc16_table
                                                                        [((uint)uVar4 ^
                                                                         ((uint)uVar11 << 8 ^
                                                                         (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar11 >> 8) ^
                                                   (uint)(byte)(uVar10 >> 0x38)]) >> 8 & 0xff) &
                                                  0xff]) >> 8 & 0xff) & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar5 ^ ((uint)ma_dr_flac__crc16_table
                                                                         [((uint)uVar4 ^
                                                                          ((uint)uVar11 << 8 ^
                                                                          (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar11 >> 8) ^
                                                   (uint)(byte)(uVar10 >> 0x38)]) >> 8 & 0xff) &
                                                  0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar5 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(uVar11 >> 8) ^
                                                                 (uint)(byte)(uVar10 >> 0x38)] << 8
                                                         ^ (uint)ma_dr_flac__crc16_table
                                                                 [((uint)uVar4 ^
                                                                  ((uint)uVar11 << 8 ^
                                                                  (uint)ma_dr_flac__crc16_table
                                                                        [(uint)(uVar11 >> 8) ^
                                                                         (uint)(byte)(uVar10 >> 0x38
                                                                                     )]) >> 8 & 0xff
                                                                  ) & 0xff]) >> 8 & 0xff) & 0xff])
                                                  >> 8 & 0xff) & 0xff]) >> 8 & 0xff ^ uVar14 & 0xff]
                                           ) >> 8 & 0xff ^ uVar15 & 0xffff) & 0xff]) >> 8 & 0xff])
                            >> 8 & 0xff ^ uVar9) & 0xff];
            break;
          case 1:
            uVar8 = (uint)(ushort)(uVar11 << 8 ^
                                  ma_dr_flac__crc16_table[(ushort)(uVar4 ^ uVar11 >> 8) & 0xff]);
          case 2:
            uVar8 = (uint)(ushort)((ushort)(uVar8 << 8) ^
                                  ma_dr_flac__crc16_table[(uVar5 ^ uVar8) >> 8 & 0xff]);
          case 3:
            uVar8 = (uint)(ushort)((ushort)(uVar8 << 8) ^
                                  ma_dr_flac__crc16_table[(uVar5 ^ uVar8 >> 8) & 0xff]);
          case 4:
            uVar8 = (uint)(ushort)((ushort)(uVar8 << 8) ^
                                  ma_dr_flac__crc16_table[uVar8 >> 8 ^ uVar14 & 0xff]);
          case 5:
            uVar8 = (uint)(ushort)((ushort)(uVar8 << 8) ^
                                  ma_dr_flac__crc16_table[(uVar8 >> 8 ^ uVar15 & 0xffff) & 0xff]);
          case 6:
            uVar12 = (ulong)(ushort)((ushort)(uVar8 << 8) ^
                                    ma_dr_flac__crc16_table[(uVar9 ^ uVar8) >> 8 & 0xff]);
          case 7:
            uVar11 = (ushort)((int)uVar12 << 8) ^
                     ma_dr_flac__crc16_table[(uVar9 ^ (uint)(uVar12 >> 8)) & 0xff];
          default:
            (pFlac->bs).crc16 = uVar11;
            (pFlac->bs).crc16CacheIgnoredBytes = 0;
          }
        }
        else {
          uVar10 = uVar10 >> (-(char)uVar14 & 0x3fU);
          uVar15 = (uint)(uVar10 >> 0x20);
          switch(~(pFlac->bs).crc16CacheIgnoredBytes + (uVar14 >> 3)) {
          case 7:
            uVar8 = (uint)(ushort)(uVar11 << 8 ^
                                  ma_dr_flac__crc16_table
                                  [(uint)(uVar11 >> 8) ^ (uint)(byte)(uVar10 >> 0x38)]);
          case 6:
            uVar8 = (uint)(ushort)((ushort)(uVar8 << 8) ^
                                  ma_dr_flac__crc16_table
                                  [((uint)(ushort)(uVar10 >> 0x30) ^ uVar8 >> 8) & 0xff]);
          case 5:
            uVar8 = (uint)(ushort)((ushort)(uVar8 << 8) ^
                                  ma_dr_flac__crc16_table[(uVar15 ^ uVar8) >> 8 & 0xff]);
          case 4:
            uVar8 = (uint)(ushort)((ushort)(uVar8 << 8) ^
                                  ma_dr_flac__crc16_table[(uVar15 ^ uVar8 >> 8) & 0xff]);
          case 3:
            uVar8 = (uint)(ushort)((ushort)(uVar8 << 8) ^
                                  ma_dr_flac__crc16_table
                                  [uVar8 >> 8 ^ (uint)(uVar10 >> 0x18) & 0xff]);
          case 2:
            uVar8 = (uint)(ushort)((ushort)(uVar8 << 8) ^
                                  ma_dr_flac__crc16_table
                                  [(uVar8 >> 8 ^ (uint)(uVar10 >> 0x10) & 0xffff) & 0xff]);
          case 1:
            uVar12 = (ulong)(ushort)((ushort)(uVar8 << 8) ^
                                    ma_dr_flac__crc16_table[((uint)uVar10 ^ uVar8) >> 8 & 0xff]);
          case 0:
            uVar11 = (ushort)((int)uVar12 << 8) ^
                     ma_dr_flac__crc16_table[((uint)uVar10 ^ (uint)(uVar12 >> 8)) & 0xff];
          default:
            (pFlac->bs).crc16 = uVar11;
            (pFlac->bs).crc16CacheIgnoredBytes = uVar14 >> 3;
          }
        }
        mVar3 = (pFlac->bs).crc16;
        mVar7 = ma_dr_flac__read_uint16(bs,0x10,(ma_uint16 *)((long)&uStack_38 + 6));
        if (mVar7 == 0) {
          mVar13 = MA_AT_END;
        }
        else {
          mVar13 = MA_CRC_MISMATCH;
          if (mVar3 == uStack_38._6_2_) {
            mVar13 = MA_SUCCESS;
          }
        }
      }
      return mVar13;
    }
  } while( true );
}

Assistant:

static ma_result ma_dr_flac__seek_flac_frame(ma_dr_flac* pFlac)
{
    int channelCount;
    int i;
    ma_uint16 desiredCRC16;
#ifndef MA_DR_FLAC_NO_CRC
    ma_uint16 actualCRC16;
#endif
    channelCount = ma_dr_flac__get_channel_count_from_channel_assignment(pFlac->currentFLACFrame.header.channelAssignment);
    for (i = 0; i < channelCount; ++i) {
        if (!ma_dr_flac__seek_subframe(&pFlac->bs, &pFlac->currentFLACFrame, i)) {
            return MA_ERROR;
        }
    }
    if (!ma_dr_flac__seek_bits(&pFlac->bs, MA_DR_FLAC_CACHE_L1_BITS_REMAINING(&pFlac->bs) & 7)) {
        return MA_ERROR;
    }
#ifndef MA_DR_FLAC_NO_CRC
    actualCRC16 = ma_dr_flac__flush_crc16(&pFlac->bs);
#endif
    if (!ma_dr_flac__read_uint16(&pFlac->bs, 16, &desiredCRC16)) {
        return MA_AT_END;
    }
#ifndef MA_DR_FLAC_NO_CRC
    if (actualCRC16 != desiredCRC16) {
        return MA_CRC_MISMATCH;
    }
#endif
    return MA_SUCCESS;
}